

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

void __thiscall
webrtc::Matrix<std::complex<float>_>::Matrix
          (Matrix<std::complex<float>_> *this,size_t num_rows,size_t num_columns)

{
  this->_vptr_Matrix = (_func_int **)&PTR__Matrix_001d09f8;
  this->num_rows_ = num_rows;
  this->num_columns_ = num_columns;
  (this->data_).super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->elements_).
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements_).
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements_).
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scratch_data_).
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scratch_data_).
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scratch_data_).
  super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->scratch_elements_).
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scratch_elements_).
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scratch_elements_).
  super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Resize(this);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::resize
            (&this->scratch_data_,this->num_columns_ * this->num_rows_);
  std::vector<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>::resize
            (&this->scratch_elements_,this->num_rows_);
  return;
}

Assistant:

Matrix(size_t num_rows, size_t num_columns)
      : num_rows_(num_rows), num_columns_(num_columns) {
    Resize();
    scratch_data_.resize(num_rows_ * num_columns_);
    scratch_elements_.resize(num_rows_);
  }